

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageLogSink.h
# Opt level: O0

void __thiscall
MessageLogSink<std::mutex>::registerChatBox
          (MessageLogSink<std::mutex> *this,shared_ptr<gui::ChatBox> *chatBox)

{
  bool bVar1;
  long in_RDI;
  uint32_t in_stack_0000005c;
  Color *in_stack_00000060;
  String *in_stack_00000068;
  ChatBox *in_stack_00000070;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>
  *msg;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
  *__range3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
  *in_stack_ffffffffffffff58;
  reference in_stack_ffffffffffffff60;
  locale *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  String *in_stack_ffffffffffffffb0;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>_>
  local_20;
  long local_18;
  
  bVar1 = std::operator!=((shared_ptr<gui::ChatBox> *)in_stack_ffffffffffffff60,
                          in_stack_ffffffffffffff58);
  if (bVar1) {
    local_18 = in_RDI + 0x50;
    local_20._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
            ::begin(in_stack_ffffffffffffff58);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
    ::end(in_stack_ffffffffffffff58);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>_>
                               *)in_stack_ffffffffffffff60,
                              (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>_>
                               *)in_stack_ffffffffffffff58), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>_>
      ::operator*(&local_20);
      std::__shared_ptr_access<gui::ChatBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<gui::ChatBox,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1b9edd);
      std::locale::locale((locale *)&stack0xffffffffffffffa8);
      sf::String::String(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                         in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffff58 =
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
            *)(in_RDI + 0x68);
      in_stack_ffffffffffffff60 =
           std::array<std::pair<sf::Color,_unsigned_int>,_7UL>::operator[]
                     ((array<std::pair<sf::Color,_unsigned_int>,_7UL> *)in_stack_ffffffffffffff60,
                      (size_type)in_stack_ffffffffffffff58);
      std::array<std::pair<sf::Color,_unsigned_int>,_7UL>::operator[]
                ((array<std::pair<sf::Color,_unsigned_int>,_7UL> *)in_stack_ffffffffffffff60,
                 (size_type)in_stack_ffffffffffffff58);
      ::gui::ChatBox::addLines
                (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_0000005c);
      sf::String::~String((String *)0x1b9f66);
      std::locale::~locale((locale *)&stack0xffffffffffffffa8);
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>_>
      ::operator++(&local_20);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
    ::clear((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
             *)0x1b9fc4);
  }
  std::weak_ptr<gui::ChatBox>::operator=
            ((weak_ptr<gui::ChatBox> *)in_stack_ffffffffffffff60,
             (shared_ptr<gui::ChatBox> *)in_stack_ffffffffffffff58);
  return;
}

Assistant:

void registerChatBox(std::shared_ptr<gui::ChatBox> chatBox) {
        if (chatBox != nullptr) {
            for (const auto& msg : bufferedMessages_) {
                chatBox->addLines(msg.first, styles_[msg.second].first, styles_[msg.second].second);
            }
            bufferedMessages_.clear();
        }
        chatBox_ = chatBox;
    }